

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

void scalar_encode(uint8_t *out,scalar *s,int bits)

{
  int iVar1;
  int local_34;
  int out_bits_remaining;
  int chunk_bits;
  int element_bits_done;
  int iStack_24;
  uint16_t element;
  int i;
  int out_byte_bits;
  uint8_t out_byte;
  int bits_local;
  scalar *s_local;
  uint8_t *out_local;
  
  if (0x10 < bits || bits == 1) {
    __assert_fail("bits <= (int)sizeof(*s->c) * 8 && bits != 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber.cc"
                  ,0x18c,"void scalar_encode(uint8_t *, const scalar *, int)");
  }
  i._3_1_ = 0;
  iStack_24 = 0;
  s_local = (scalar *)out;
  for (element_bits_done = 0; element_bits_done < 0x100; element_bits_done = element_bits_done + 1)
  {
    chunk_bits._2_2_ = s->c[element_bits_done];
    for (out_bits_remaining = 0; out_bits_remaining < bits;
        out_bits_remaining = local_34 + out_bits_remaining) {
      local_34 = bits - out_bits_remaining;
      iVar1 = -iStack_24 + 8;
      if (local_34 < iVar1) {
        i._3_1_ = i._3_1_ | (byte)(((uint)chunk_bits._2_2_ & (uint)kMasks[local_34 + -1]) <<
                                  ((byte)iStack_24 & 0x1f));
        iStack_24 = local_34 + iStack_24;
      }
      else {
        *(byte *)s_local->c =
             i._3_1_ | (byte)(((uint)chunk_bits._2_2_ & (uint)kMasks[-iStack_24 + 7]) <<
                             ((byte)iStack_24 & 0x1f));
        s_local = (scalar *)((long)s_local->c + 1);
        iStack_24 = 0;
        i._3_1_ = 0;
        local_34 = iVar1;
      }
      chunk_bits._2_2_ = (uint16_t)((int)(uint)chunk_bits._2_2_ >> ((byte)local_34 & 0x1f));
    }
  }
  if (0 < iStack_24) {
    *(byte *)s_local->c = i._3_1_;
  }
  return;
}

Assistant:

static void scalar_encode(uint8_t *out, const scalar *s, int bits) {
  assert(bits <= (int)sizeof(*s->c) * 8 && bits != 1);

  uint8_t out_byte = 0;
  int out_byte_bits = 0;

  for (int i = 0; i < DEGREE; i++) {
    uint16_t element = s->c[i];
    int element_bits_done = 0;

    while (element_bits_done < bits) {
      int chunk_bits = bits - element_bits_done;
      int out_bits_remaining = 8 - out_byte_bits;
      if (chunk_bits >= out_bits_remaining) {
        chunk_bits = out_bits_remaining;
        out_byte |= (element & kMasks[chunk_bits - 1]) << out_byte_bits;
        *out = out_byte;
        out++;
        out_byte_bits = 0;
        out_byte = 0;
      } else {
        out_byte |= (element & kMasks[chunk_bits - 1]) << out_byte_bits;
        out_byte_bits += chunk_bits;
      }

      element_bits_done += chunk_bits;
      element >>= chunk_bits;
    }
  }

  if (out_byte_bits > 0) {
    *out = out_byte;
  }
}